

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
               (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *rhs,
               Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest,Scalar *alpha)

{
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *this;
  double *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense> *pTVar2;
  Index cols;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  ScalarWithConstIfNotLvalue **ppSVar6;
  Scalar SVar7;
  Scalar SVar8;
  double alpha_00;
  ScalarWithConstIfNotLvalue *local_1e8;
  Scalar local_1e0;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *local_1d8;
  double *local_1d0;
  size_t local_1c8;
  Index local_1c0;
  TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense> *local_1b8;
  Index local_1b0;
  Scalar *local_1a8;
  double *local_1a0;
  Scalar *local_198;
  Scalar *local_190;
  double local_188;
  double local_180;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
  local_178;
  const_blas_data_mapper<double,_long,_0> local_140 [2];
  const_blas_data_mapper<double,_long,_1> local_120;
  undefined1 local_110 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<double,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest_local;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *rhs_local;
  Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs_local;
  
  ppSVar6 = &local_1e8;
  actualRhs.m_matrix.m_matrix =
       (non_const_type)
       blas_traits<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::extract(lhs)
  ;
  actualAlpha = (ResScalar)
                blas_traits<Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::extract(rhs);
  local_188 = *alpha;
  SVar7 = blas_traits<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(lhs);
  local_180 = local_188 * SVar7;
  SVar8 = blas_traits<Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::extractScalarFactor(rhs);
  alpha_00 = local_180 * SVar8;
  uVar3 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&actualAlpha);
  if (0x1fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&actualAlpha);
    if ((ulong)(IVar5 * 8) < 0x20001) {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&actualAlpha);
      lVar1 = -(IVar5 * 8 + 0x1eU & 0xfffffffffffffff0);
      ppSVar6 = (ScalarWithConstIfNotLvalue **)((long)&local_1e8 + lVar1);
      local_198 = (Scalar *)((long)&local_1e0 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&actualAlpha);
      local_198 = (Scalar *)aligned_malloc(IVar5 << 3);
    }
    local_190 = local_198;
  }
  else {
    local_190 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
                ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                        *)&actualAlpha);
    ppSVar6 = &local_1e8;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_190;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e61ed;
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar4 == (Scalar *)0x0) {
    local_1a0 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_1a0 = (double *)0x0;
  }
  local_1d0 = local_1a0;
  local_1d8 = (EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)&actualAlpha;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e622f;
  local_1c8 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&actualAlpha);
  this = local_1d8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e6242;
  IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::size(this);
  size = local_1c8;
  ptr = local_1d0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e626c;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_110,ptr,size,
             0x20000 < (ulong)(IVar5 << 3));
  local_1b8 = (TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
              &actualRhs;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e627f;
  local_1c0 = Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&actualRhs);
  pTVar2 = local_1b8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e6292;
  local_1b0 = Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pTVar2);
  pTVar2 = local_1b8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e62a5;
  local_1a8 = TransposeImpl<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                        (pTVar2);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e62ba;
  local_1e0 = (Scalar)TransposeImpl<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::
                      outerStride((TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense>
                                   *)&actualRhs);
  local_120.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = local_1a8;
  local_140[0].super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
       (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_140[0].super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
  local_120.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = (long)local_1e0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e63dc;
  local_1e8 = TransposeImpl<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Dense>::data
                        ((TransposeImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Dense> *)dest
                        );
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e63fc;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>::col
            ((ColXpr *)&local_178,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)dest,0);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e640a;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_-1,_1,_true,_true>
            ::innerStride(&local_178);
  cols = local_1b0;
  rows = local_1c0;
  res = local_1e8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e643d;
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(rows,cols,&local_120,local_140,res,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x1e644b;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_110);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }